

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double brcmp1(int *mu,double *a,double *b,double *x,double *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_48;
  
  brcmp1::a0 = *a;
  if (*b <= *a) {
    brcmp1::a0 = *b;
  }
  if (8.0 <= brcmp1::a0) {
    dVar5 = *a;
    dVar6 = *b;
    if (dVar5 <= dVar6) {
      dVar7 = dVar5 / dVar6 + 1.0;
      auVar11._8_8_ = dVar5 / dVar6;
      auVar11._0_8_ = 0x3ff0000000000000;
      auVar9._8_8_ = dVar7;
      auVar9._0_8_ = dVar7;
      auVar9 = divpd(auVar11,auVar9);
      brcmp1::lambda = dVar5 - (dVar5 + dVar6) * *x;
    }
    else {
      auVar10._0_8_ = dVar6 / dVar5;
      auVar10._8_8_ = 0x3ff0000000000000;
      auVar2._8_8_ = auVar10._0_8_ + 1.0;
      auVar2._0_8_ = auVar10._0_8_ + 1.0;
      auVar9 = divpd(auVar10,auVar2);
      brcmp1::lambda = (dVar5 + dVar6) * *y - dVar6;
    }
    brcmp1::x0 = auVar9._8_8_;
    brcmp1::y0 = auVar9._0_8_;
    dVar5 = -brcmp1::lambda / dVar5;
    brcmp1::e = dVar5;
    if (ABS(dVar5) <= 0.6) {
      brcmp1::u = rlog1(&brcmp1::e);
    }
    else {
      dVar6 = log(*x / brcmp1::x0);
      brcmp1::u = dVar5 - dVar6;
    }
    dVar5 = brcmp1::lambda / *b;
    brcmp1::e = dVar5;
    if (ABS(dVar5) <= 0.6) {
      dVar5 = rlog1(&brcmp1::e);
    }
    else {
      dVar6 = log(*y / brcmp1::y0);
      dVar5 = dVar5 - dVar6;
    }
    brcmp1::T4 = -(*a * brcmp1::u + dVar5 * *b);
    brcmp1::z = esum(mu,&brcmp1::T4);
    dVar5 = *b * brcmp1::x0;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
    local_48 = dVar5 * 0.398942280401433 * brcmp1::z;
    dVar5 = bcorr(a,b);
    dVar5 = exp(-dVar5);
  }
  else {
    dVar5 = *x;
    if (dVar5 <= 0.375) {
      brcmp1::lnx = log(dVar5);
      brcmp1::T1 = -*x;
      dVar5 = alnrel(&brcmp1::T1);
    }
    else {
      if (*y <= 0.375) {
        brcmp1::T2 = -*y;
        brcmp1::lnx = alnrel(&brcmp1::T2);
      }
      else {
        brcmp1::lnx = log(dVar5);
      }
      dVar5 = log(*y);
    }
    brcmp1::z = *a * brcmp1::lnx + dVar5 * *b;
    if (1.0 <= brcmp1::a0) {
      dVar5 = betaln(a,b);
      brcmp1::z = brcmp1::z - dVar5;
      dVar5 = esum(mu,&brcmp1::z);
      return dVar5;
    }
    brcmp1::b0 = *b;
    if (*b <= *a) {
      brcmp1::b0 = *a;
    }
    if (brcmp1::b0 < 8.0) {
      if (1.0 < brcmp1::b0) {
        brcmp1::u = gamln1(&brcmp1::a0);
        dVar5 = brcmp1::b0 + -1.0;
        iVar3 = (int)dVar5;
        if (0 < iVar3) {
          dVar5 = 1.0;
          while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
            brcmp1::b0 = brcmp1::b0 + -1.0;
            dVar5 = dVar5 * (brcmp1::b0 / (brcmp1::b0 + brcmp1::a0));
          }
          dVar5 = log(dVar5);
          brcmp1::u = dVar5 + brcmp1::u;
          dVar5 = brcmp1::b0 + -1.0;
        }
        brcmp1::z = brcmp1::z - brcmp1::u;
        brcmp1::apb = dVar5 + brcmp1::a0;
        brcmp1::b0 = dVar5;
        if (brcmp1::apb <= 1.0) {
          dVar5 = gam1(&brcmp1::apb);
          brcmp1::t = dVar5 + 1.0;
        }
        else {
          brcmp1::u = brcmp1::apb + -1.0;
          dVar5 = gam1(&brcmp1::u);
          brcmp1::t = (dVar5 + 1.0) / brcmp1::apb;
        }
        dVar5 = brcmp1::a0;
        dVar6 = esum(mu,&brcmp1::z);
        dVar7 = gam1(&brcmp1::b0);
        return ((dVar7 + 1.0) * dVar6 * dVar5) / brcmp1::t;
      }
      dVar5 = esum(mu,&brcmp1::z);
      if ((dVar5 == 0.0) && (!NAN(dVar5))) {
        return dVar5;
      }
      brcmp1::apb = *a + *b;
      if (brcmp1::apb <= 1.0) {
        dVar6 = gam1(&brcmp1::apb);
        brcmp1::z = dVar6 + 1.0;
      }
      else {
        brcmp1::u = *a + *b + -1.0;
        dVar6 = gam1(&brcmp1::u);
        brcmp1::z = (dVar6 + 1.0) / brcmp1::apb;
      }
      dVar6 = gam1(a);
      dVar7 = gam1(b);
      auVar8._0_8_ = (dVar7 + 1.0) * (dVar6 + 1.0);
      auVar8._8_8_ = brcmp1::a0;
      auVar1._8_8_ = brcmp1::b0;
      auVar1._0_8_ = brcmp1::z;
      auVar9 = divpd(auVar8,auVar1);
      return (dVar5 * brcmp1::a0 * auVar9._0_8_) / (auVar9._8_8_ + 1.0);
    }
    dVar5 = gamln1(&brcmp1::a0);
    dVar6 = algdiv(&brcmp1::a0,&brcmp1::b0);
    brcmp1::u = dVar6 + dVar5;
    brcmp1::T3 = brcmp1::z - brcmp1::u;
    local_48 = brcmp1::a0;
    dVar5 = esum(mu,&brcmp1::T3);
  }
  return dVar5 * local_48;
}

Assistant:

double brcmp1(int *mu,double *a,double *b,double *x,double *y)
/*
-----------------------------------------------------------------------
          EVALUATION OF  EXP(MU) * (X**A*Y**B/BETA(A,B))
-----------------------------------------------------------------------
*/
{
static double Const = .398942280401433e0;
static double brcmp1,a0,apb,b0,c,e,h,lambda,lnx,lny,t,u,v,x0,y0,z;
static int i,n;
/*
-----------------
     CONST = 1/SQRT(2*PI)
-----------------
*/
static double T1,T2,T3,T4;
/*
     ..
     .. Executable Statements ..
*/
    a0 = fifdmin1(*a,*b);
    if(a0 >= 8.0e0) goto S130;
    if(*x > 0.375e0) goto S10;
    lnx = log(*x);
    T1 = -*x;
    lny = alnrel(&T1);
    goto S30;
S10:
    if(*y > 0.375e0) goto S20;
    T2 = -*y;
    lnx = alnrel(&T2);
    lny = log(*y);
    goto S30;
S20:
    lnx = log(*x);
    lny = log(*y);
S30:
    z = *a*lnx+*b*lny;
    if(a0 < 1.0e0) goto S40;
    z -= betaln(a,b);
    brcmp1 = esum(mu,&z);
    return brcmp1;
S40:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .LT. 1 OR B .LT. 1
-----------------------------------------------------------------------
*/
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S120;
    if(b0 > 1.0e0) goto S70;
/*
                   ALGORITHM FOR B0 .LE. 1
*/
    brcmp1 = esum(mu,&z);
    if(brcmp1 == 0.0e0) return brcmp1;
    apb = *a+*b;
    if(apb > 1.0e0) goto S50;
    z = 1.0e0+gam1(&apb);
    goto S60;
S50:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S60:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    brcmp1 = brcmp1*(a0*c)/(1.0e0+a0/b0);
    return brcmp1;
S70:
/*
                ALGORITHM FOR 1 .LT. B0 .LT. 8
*/
    u = gamln1(&a0);
    n = b0-1.0e0;
    if(n < 1) goto S90;
    c = 1.0e0;
    for(i=1; i<=n; i++) {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S90:
    z -= u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S100;
    t = 1.0e0+gam1(&apb);
    goto S110;
S100:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S110:
    brcmp1 = a0*esum(mu,&z)*(1.0e0+gam1(&b0))/t;
    return brcmp1;
S120:
/*
                   ALGORITHM FOR B0 .GE. 8
*/
    u = gamln1(&a0)+algdiv(&a0,&b0);
    T3 = z-u;
    brcmp1 = a0*esum(mu,&T3);
    return brcmp1;
S130:
/*
-----------------------------------------------------------------------
              PROCEDURE FOR A .GE. 8 AND B .GE. 8
-----------------------------------------------------------------------
*/
    if(*a > *b) goto S140;
    h = *a/ *b;
    x0 = h/(1.0e0+h);
    y0 = 1.0e0/(1.0e0+h);
    lambda = *a-(*a+*b)**x;
    goto S150;
S140:
    h = *b/ *a;
    x0 = 1.0e0/(1.0e0+h);
    y0 = h/(1.0e0+h);
    lambda = (*a+*b)**y-*b;
S150:
    e = -(lambda/ *a);
    if(fabs(e) > 0.6e0) goto S160;
    u = rlog1(&e);
    goto S170;
S160:
    u = e-log(*x/x0);
S170:
    e = lambda/ *b;
    if(fabs(e) > 0.6e0) goto S180;
    v = rlog1(&e);
    goto S190;
S180:
    v = e-log(*y/y0);
S190:
    T4 = -(*a*u+*b*v);
    z = esum(mu,&T4);
    brcmp1 = Const*sqrt(*b*x0)*z*exp(-bcorr(a,b));
    return brcmp1;
}